

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,QList<QString>>::emplace<QList<QString>const&>
          (QHash<QString,QList<QString>> *this,QString *key,QList<QString> *args)

{
  Data<QHashPrivate::Node<QString,_QList<QString>_>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QString,_QList<QString>_>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) {
    local_38.d = (Data *)0x0;
LAB_00191aaf:
    pDVar1 = (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0;
LAB_00191ad0:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::detached(pDVar1);
    *(Data<QHashPrivate::Node<QString,_QList<QString>_>_> **)this = pDVar1;
LAB_00191ad8:
    pVar2 = (piter)emplace_helper<QList<QString>const&>(this,key,args);
    QHash<QString,_QList<QString>_>::~QHash((QHash<QString,_QList<QString>_> *)&local_38);
  }
  else {
    if (1 < (uint)(((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i) {
      local_38.d = (Data *)pDVar1;
      if ((((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QString,_QList<QString>_>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) goto LAB_00191aaf;
      }
      if (1 < (uint)(((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i)
      goto LAB_00191ad0;
      goto LAB_00191ad8;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<QList<QString>const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_00191b56;
    }
    local_38.d = (args->d).d;
    local_38.ptr = (args->d).ptr;
    local_38.size = (args->d).size;
    if ((Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)local_38.d !=
        (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) {
      LOCK();
      (((QArrayData *)&((Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)local_38.d)->ref)->
      ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&((Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)local_38.d)->ref
            )->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar2 = (piter)emplace_helper<QList<QString>>(this,key,(QList<QString> *)&local_38);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_00191b56:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }